

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

Complex __thiscall rtb::Filter::Filter<double>::feedbackCoefficientsProduct(Filter<double> *this)

{
  const_reference __x;
  undefined8 uVar1;
  complex<double> cVar2;
  complex<double> local_58;
  complex<double> local_48;
  uint local_34;
  undefined1 local_30 [4];
  uint k;
  Complex result;
  Filter<double> *this_local;
  
  uVar1 = 0;
  result._M_value._8_8_ = this;
  std::complex<double>::complex((complex<double> *)local_30,0.0,0.0);
  for (local_34 = 1; (ulong)local_34 < this->n_; local_34 = local_34 + 1) {
    __x = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                    (&this->y_,((this->n_ - (ulong)local_34) + this->count_) % this->n_);
    TransferFunction<double>::a(&this->tf_,local_34);
    local_58._M_value._8_8_ = uVar1;
    std::operator*(__x,&local_58);
    local_48._M_value._8_8_ = uVar1;
    std::complex<double>::operator+=((complex<double> *)local_30,&local_48);
  }
  cVar2 = std::operator-((complex<double> *)local_30);
  return (Complex)cVar2._M_value;
}

Assistant:

typename Filter<T>::Complex Filter<T>::feedbackCoefficientsProduct() const {

            Complex result{ 0 };
            for (unsigned k{ 1 }; k < n_; ++k)
                result += y_.at((n_ - k + count_) % n_)*tf_.a(k);
            return -result;
        }